

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometrybasic.hpp
# Opt level: O3

bool __thiscall BasicPrimitive::intersect(BasicPrimitive *this,Ray *ray,Hit *result)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec2f vVar5;
  int iVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float fVar7;
  float fVar8;
  float t;
  float local_6c;
  undefined3 uStack_67;
  undefined1 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 local_48;
  undefined4 uStack_44;
  float local_30;
  float fStack_2c;
  float local_28;
  
  iVar6 = (*(this->super_Primitive)._vptr_Primitive[3])(this,ray,&local_6c);
  if (SUB41(iVar6,0) != false) {
    uVar1 = (ray->origin).x;
    uVar3 = (ray->origin).y;
    uVar2 = (ray->dir).x;
    uVar4 = (ray->dir).y;
    local_30 = local_6c * (float)uVar2 + (float)uVar1;
    fStack_2c = local_6c * (float)uVar4 + (float)uVar3;
    fVar7 = (ray->dir).z * local_6c + (ray->origin).z;
    local_28 = fVar7;
    (*(this->super_Primitive)._vptr_Primitive[4])(this,&local_30);
    fVar8 = fVar7;
    local_48 = extraout_XMM0_Da;
    uStack_44 = extraout_XMM0_Db;
    (*(this->super_Primitive)._vptr_Primitive[5])(this,&local_30);
    local_58 = extraout_XMM0_Da_00;
    uStack_54 = extraout_XMM0_Db_00;
    (*(this->super_Primitive)._vptr_Primitive[6])(this,&local_30);
    result->hit = true;
    uStack_60 = SUB41(fStack_2c,0);
    *(ulong *)&result->field_0x1 = CONCAT17(uStack_60,CONCAT43(local_30,uStack_67));
    (result->p).y = fStack_2c;
    (result->p).z = local_28;
    (result->Ns).x = (float)local_48;
    (result->Ns).y = (float)uStack_44;
    (result->Ns).z = fVar7;
    (result->Ng).x = (float)local_58;
    (result->Ng).y = (float)uStack_54;
    (result->Ng).z = fVar8;
    vVar5.y = extraout_XMM0_Db_01;
    vVar5.x = extraout_XMM0_Da_01;
    result->uv = vVar5;
    (result->dpdu).x = 0.0;
    (result->dpdu).y = 0.0;
    *(undefined8 *)&(result->dpdu).z = 0;
    (result->dpdv).y = 0.0;
    (result->dpdv).z = 0.0;
  }
  return SUB41(iVar6,0);
}

Assistant:

bool BasicPrimitive::intersect(const Ray& ray, Hit* result) const
{
	float t;
	bool b = intersect(ray, t);
	if (!b) return false;
	point p = ray.atParam(t);
	*result = Hit(p, Ns(p), Ng(p), uv(p));
	return true;
}